

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_image.cpp
# Opt level: O3

int getBytesPerPixel(FE_IMAGE_FORMAT tf)

{
  int iVar1;
  
  iVar1 = 0;
  if (tf - FE_IMG_A8 < 5) {
    iVar1 = *(int *)(&DAT_00116054 + (ulong)(tf - FE_IMG_A8) * 4);
  }
  return iVar1;
}

Assistant:

int getBytesPerPixel(FE_IMAGE_FORMAT tf)
{
    switch (tf)
    {
        case FE_IMG_A8:
            return 1;
        case FE_IMG_B8G8R8A8:
        case FE_IMG_R8G8B8A8:
            return 4;
        case FE_IMG_DISTANCE:
            return sizeof(PixDist);
        default:
            return 0;
    }
    return 0;
}